

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

void __thiscall
node::BlockManager::BlockManager(BlockManager *this,SignalInterrupt *interrupt,Options *opts)

{
  long lVar1;
  long in_RDX;
  size_type in_RSI;
  FlatFileSeq *in_RDI;
  long in_FS_OFFSET;
  unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
  *in_stack_ffffffffffffff18;
  BlockManagerOpts *in_stack_ffffffffffffff20;
  BlockManagerOpts *in_stack_ffffffffffffff28;
  FlatFileSeq *chunk_size;
  size_t *prefix;
  size_t *dir;
  FlatFileSeq *this_00;
  Options *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AnnotatedMixin<std::recursive_mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::vector
            ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)in_stack_ffffffffffffff18);
  in_RDI[1].m_dir.super_path._M_pathname._M_string_length = 0;
  in_RDI[1].m_dir.super_path._M_pathname.field_2._M_allocated_capacity = 1;
  *(undefined8 *)((long)&in_RDI[1].m_dir.super_path._M_pathname.field_2 + 8) = 0;
  *(undefined1 *)
   &in_RDI[1].m_dir.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl = 0;
  *(bool *)((long)&in_RDI[1].m_dir.super_path._M_cmpts._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t + 1) = *(long *)(in_RDX + 0x10) != 0;
  InitBlocksdirXorKey(in_stack_ffffffffffffffc8);
  std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::set
            ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
             in_stack_ffffffffffffff18);
  chunk_size = this_00 + 3;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff18);
  prefix = &this_00[3].m_chunk_size;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node::PruneLockInfo>_>_>
                   *)in_stack_ffffffffffffff18);
  dir = &this_00[4].m_chunk_size;
  kernel::BlockManagerOpts::BlockManagerOpts(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  fs::path::path((path *)in_stack_ffffffffffffff18,(path *)0x10ff332);
  FlatFileSeq::FlatFileSeq(this_00,(path *)dir,(char *)prefix,(size_t)chunk_size);
  fs::path::~path((path *)in_stack_ffffffffffffff18);
  fs::path::path((path *)in_stack_ffffffffffffff18,(path *)0x10ff39f);
  FlatFileSeq::FlatFileSeq(this_00,(path *)dir,(char *)prefix,(size_t)chunk_size);
  fs::path::~path((path *)in_stack_ffffffffffffff18);
  this_00[8].m_dir.super_path._M_pathname.field_2._M_allocated_capacity = in_RSI;
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_ffffffffffffff18,false);
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_ffffffffffffff18,false);
  std::
  unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
  ::unordered_map(in_stack_ffffffffffffff18);
  std::optional<int>::optional((optional<int> *)in_stack_ffffffffffffff18);
  std::
  multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  ::multimap((multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
              *)in_stack_ffffffffffffff18);
  std::unique_ptr<kernel::BlockTreeDB,std::default_delete<kernel::BlockTreeDB>>::
  unique_ptr<std::default_delete<kernel::BlockTreeDB>,void>
            ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
             in_stack_ffffffffffffff18);
  *(undefined1 *)&this_00[10].m_prefix = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BlockManager::BlockManager(const util::SignalInterrupt& interrupt, Options opts)
    : m_prune_mode{opts.prune_target > 0},
      m_xor_key{InitBlocksdirXorKey(opts)},
      m_opts{std::move(opts)},
      m_block_file_seq{FlatFileSeq{m_opts.blocks_dir, "blk", m_opts.fast_prune ? 0x4000 /* 16kB */ : BLOCKFILE_CHUNK_SIZE}},
      m_undo_file_seq{FlatFileSeq{m_opts.blocks_dir, "rev", UNDOFILE_CHUNK_SIZE}},
      m_interrupt{interrupt} {}